

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderMatrixTests.cpp
# Opt level: O2

void deqp::gles2::Functional::MatrixCaseUtils::Evaluator<2,_2,_13,_0,_4>::evaluate
               (ShaderEvalContext *evalCtx)

{
  int in_ECX;
  Vector<float,_3> local_a8;
  tcu local_98 [8];
  float local_90;
  float local_8c;
  Vector<float,_4> local_88;
  VecAccess<float,_4,_3> local_78;
  Mat4 local_60;
  
  getInputValue<2,13>(&local_60,(MatrixCaseUtils *)evalCtx,(ShaderEvalContext *)0x0,in_ECX);
  tcu::Vector<float,_4>::Vector(&local_88,(Vector<float,_4> *)(s_constInVec4 + 0x10));
  tcu::operator*(local_98,&local_60,&local_88);
  local_a8.m_data[2] = local_90 + local_8c;
  local_a8.m_data._0_8_ = local_98;
  local_78.m_vector = &evalCtx->color;
  local_78.m_index[0] = 0;
  local_78.m_index[1] = 1;
  local_78.m_index[2] = 2;
  tcu::VecAccess<float,_4,_3>::operator=(&local_78,&local_a8);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx)
	{
		evalCtx.color.xyz() = reduceToVec3(getInputValue<In0Type, In0DataType>(evalCtx, 0) * getInputValue<In1Type, In1DataType>(evalCtx, 1));
	}